

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O2

bool __thiscall
helics::PublicationInfo::addSubscriber
          (PublicationInfo *this,GlobalHandle newSubscriber,string_view subscriberName)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer pSVar3;
  SubscriberInformation *sub;
  GlobalHandle local_28;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = subscriberName._M_str;
  local_20._M_len = subscriberName._M_len;
  pSVar1 = (this->subscribers).
           super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar2 = (this->subscribers).
           super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    pSVar3 = pSVar2;
    if (pSVar3 == pSVar1) {
      local_28 = newSubscriber;
      std::vector<helics::SubscriberInformation,std::allocator<helics::SubscriberInformation>>::
      emplace_back<helics::GlobalHandle&,std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<helics::SubscriberInformation,std::allocator<helics::SubscriberInformation>>
                  *)&this->subscribers,&local_28,&local_20);
      break;
    }
    pSVar2 = pSVar3 + 1;
  } while (((pSVar3->id).fed_id.gid != newSubscriber.fed_id.gid.gid) ||
          ((pSVar3->id).handle.hid != newSubscriber.handle.hid.hid));
  return pSVar3 == pSVar1;
}

Assistant:

bool PublicationInfo::addSubscriber(GlobalHandle newSubscriber, std::string_view subscriberName)
{
    for (auto& sub : subscribers) {
        if (sub.id == newSubscriber) {
            return false;
        }
    }
    subscribers.emplace_back(newSubscriber, subscriberName);
    return true;
}